

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

void __thiscall imrt::Station::clearIntensity(Station *this)

{
  double **ppdVar1;
  int iVar2;
  pair<int,_int> pVar3;
  ulong uVar4;
  int i;
  long lVar5;
  
  lVar5 = 0;
  while( true ) {
    iVar2 = Collimator::getXdim(this->collimator);
    if (iVar2 <= lVar5) break;
    pVar3 = Collimator::getActiveRange(this->collimator,(int)lVar5,this->angle);
    if (-1 < pVar3.first) {
      ppdVar1 = (this->I).p;
      for (uVar4 = (ulong)(pVar3.first & 0x7fffffff); (int)uVar4 <= pVar3.second; uVar4 = uVar4 + 1)
      {
        ppdVar1[lVar5][uVar4] = 0.0;
      }
    }
    lVar5 = lVar5 + 1;
  }
  return;
}

Assistant:

void Station::clearIntensity() {
    pair<int,int> aux;
    for (int i=0; i < collimator.getXdim(); i++) {
      aux = collimator.getActiveRange(i,angle);
      if (aux.first<0) continue;
      for (int j=aux.first; j<=aux.second; j++) I(i,j)=0;
    }
  }